

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O3

Ptr __thiscall core::image::int_to_byte_image(image *this,ConstPtr *image)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  element_type *peVar6;
  Image<unsigned_char> *__p;
  long lVar7;
  invalid_argument *this_00;
  uint uVar8;
  pointer piVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  Ptr PVar11;
  
  if ((image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    __p = (Image<unsigned_char> *)operator_new(0x30);
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0014cd28;
    *(Image<unsigned_char> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    plVar5 = *(long **)this;
    peVar6 = (image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar1 = (peVar6->super_TypedImageBase<int>).super_ImageBase.w;
    iVar2 = (peVar6->super_TypedImageBase<int>).super_ImageBase.h;
    iVar3 = (peVar6->super_TypedImageBase<int>).super_ImageBase.c;
    (**(code **)(*plVar5 + 0x40))(plVar5);
    *(int *)(plVar5 + 1) = iVar1;
    *(int *)((long)plVar5 + 0xc) = iVar2;
    *(int *)(plVar5 + 2) = iVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar5 + 3),
               (long)(iVar2 * iVar1 * iVar3));
    peVar6 = (image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    piVar9 = (peVar6->super_TypedImageBase<int>).data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var10._M_pi = extraout_RDX;
    if (0 < (int)((ulong)((long)*(pointer *)
                                 ((long)&(peVar6->super_TypedImageBase<int>).data.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + 8) - (long)piVar9) >> 2)) {
      lVar7 = 0;
      do {
        uVar4 = piVar9[lVar7];
        uVar8 = -uVar4;
        if (0 < (int)uVar4) {
          uVar8 = uVar4;
        }
        if (0xfe < uVar8) {
          uVar8 = 0xff;
        }
        *(char *)(*(long *)(*(long *)this + 0x18) + lVar7) = (char)uVar8;
        lVar7 = lVar7 + 1;
        peVar6 = (image->super___shared_ptr<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        piVar9 = (peVar6->super_TypedImageBase<int>).data.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (long)(int)((ulong)((long)*(pointer *)
                                                  ((long)&(peVar6->super_TypedImageBase<int>).data.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 8) -
                                          (long)piVar9) >> 2);
      } while (lVar7 < (long)_Var10._M_pi);
    }
    PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var10._M_pi;
    PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
int_to_byte_image (IntImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        img->at(i) = math::clamp(std::abs(image->at(i)), 0, 255);
    }
    return img;
}